

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.c
# Opt level: O1

char * golf_config_get_string(golf_config_t *cfg,char *name)

{
  golf_config_property_t *pgVar1;
  char *pcVar2;
  
  pgVar1 = (golf_config_property_t *)map_get_((map_base_t *)cfg,name);
  (cfg->properties).ref = pgVar1;
  if ((pgVar1 == (golf_config_property_t *)0x0) || (pgVar1->type != GOLF_CONFIG_PROPERTY_STRING)) {
    golf_log_warning("Invalid config property %s",name);
    pcVar2 = "";
  }
  else {
    pcVar2 = (pgVar1->field_1).string_val;
  }
  return pcVar2;
}

Assistant:

const char *golf_config_get_string(golf_config_t *cfg, const char *name) {
    golf_config_property_t *prop = map_get(&cfg->properties, name);
    if (prop && prop->type == GOLF_CONFIG_PROPERTY_STRING) {
        return prop->string_val;
    }
    else {
        golf_log_warning("Invalid config property %s", name);
        return "";
    }
}